

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O3

Vec_Int_t * Llb_ManMarkPivotNodes(Aig_Man_t *p,int fUseInternal)

{
  ulong *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      puVar1 = (ulong *)((long)pVVar7->pArray[lVar5] + 0x18);
      *puVar1 = *puVar1 | 0x10;
      lVar5 = lVar5 + 1;
      pVVar7 = p->vCis;
    } while (lVar5 < pVVar7->nSize);
  }
  if (0 < p->nRegs) {
    iVar4 = 0;
    do {
      uVar8 = p->nTruePos + iVar4;
      if (((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar8)) goto LAB_008262fa;
      puVar1 = (ulong *)((long)p->vCos->pArray[uVar8] + 0x18);
      *puVar1 = *puVar1 | 0x10;
      iVar4 = iVar4 + 1;
    } while (iVar4 < p->nRegs);
  }
  if (fUseInternal != 0) {
    Llb_ManMarkInternalPivots(p);
  }
  puVar2 = &p->pConst1->field_0x18;
  *(ulong *)puVar2 = *(ulong *)puVar2 & 0xffffffffffffffef;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_00->pArray = piVar6;
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      Vec_IntPush(p_00,*(int *)((long)pVVar7->pArray[lVar5] + 0x24));
      lVar5 = lVar5 + 1;
      pVVar7 = p->vCis;
    } while (lVar5 < pVVar7->nSize);
  }
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      pvVar3 = pVVar7->pArray[lVar5];
      if (((pvVar3 != (void *)0x0) && ((*(ulong *)((long)pvVar3 + 0x18) & 0x10) != 0)) &&
         (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7)) {
        Vec_IntPush(p_00,*(int *)((long)pvVar3 + 0x24));
        pVVar7 = p->vObjs;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar7->nSize);
  }
  if (0 < p->nRegs) {
    iVar4 = 0;
    do {
      uVar8 = p->nTruePos + iVar4;
      if (((int)uVar8 < 0) || (p->vCos->nSize <= (int)uVar8)) {
LAB_008262fa:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Vec_IntPush(p_00,*(int *)((long)p->vCos->pArray[uVar8] + 0x24));
      iVar4 = iVar4 + 1;
    } while (iVar4 < p->nRegs);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Llb_ManMarkPivotNodes( Aig_Man_t * p, int fUseInternal )
{
    Vec_Int_t * vVar2Obj;
    Aig_Obj_t * pObj;
    int i;
    // mark inputs/outputs
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkA = 1;
    Saig_ManForEachLi( p, pObj, i )
        pObj->fMarkA = 1;

    // mark internal pivot nodes
    if ( fUseInternal )
        Llb_ManMarkInternalPivots( p );

    // assign variable numbers
    Aig_ManConst1(p)->fMarkA = 0;
    vVar2Obj = Vec_IntAlloc( 100 );
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntPush( vVar2Obj, Aig_ObjId(pObj) );
    Aig_ManForEachNode( p, pObj, i )
        if ( pObj->fMarkA )
            Vec_IntPush( vVar2Obj, Aig_ObjId(pObj) );
    Saig_ManForEachLi( p, pObj, i )
        Vec_IntPush( vVar2Obj, Aig_ObjId(pObj) );
    return vVar2Obj;
}